

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O2

void __thiscall
bssl::ParseNameConstraints_DNSNamesWithMultipleLevelsBetweenExcludedAndPermitted_Test::
~ParseNameConstraints_DNSNamesWithMultipleLevelsBetweenExcludedAndPermitted_Test
          (ParseNameConstraints_DNSNamesWithMultipleLevelsBetweenExcludedAndPermitted_Test *this)

{
  ~ParseNameConstraints_DNSNamesWithMultipleLevelsBetweenExcludedAndPermitted_Test
            ((ParseNameConstraints_DNSNamesWithMultipleLevelsBetweenExcludedAndPermitted_Test *)
             &this[-1].super_ParseNameConstraints.super_TestWithParam<std::tuple<bool>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ParseNameConstraints,
       DNSNamesWithMultipleLevelsBetweenExcludedAndPermitted) {
  std::string a;
  ASSERT_TRUE(LoadTestNameConstraint("dnsname2.pem", &a));
  CertErrors errors;
  std::unique_ptr<NameConstraints> name_constraints(
      NameConstraints::Create(StringAsBytes(a), is_critical(), &errors));
  ASSERT_TRUE(name_constraints);

  // Matches permitted exactly.
  EXPECT_TRUE(name_constraints->IsPermittedDNSName("com"));
  // Contained within permitted and doesn't match excluded (foo.bar.com).
  EXPECT_TRUE(name_constraints->IsPermittedDNSName("bar.com"));
  EXPECT_TRUE(name_constraints->IsPermittedDNSName("baz.bar.com"));
  // Matches excluded exactly.
  EXPECT_FALSE(name_constraints->IsPermittedDNSName("foo.bar.com"));
  // Contained within excluded.
  EXPECT_FALSE(name_constraints->IsPermittedDNSName("baz.foo.bar.com"));

  // Cannot match anything within excluded.
  EXPECT_TRUE(name_constraints->IsPermittedDNSName("*.baz.bar.com"));
  // Wildcard hostnames only match a single label, so cannot match excluded
  // which has two labels before .com.
  EXPECT_TRUE(name_constraints->IsPermittedDNSName("*.com"));

  // Partial match of foo.bar.com.
  EXPECT_FALSE(name_constraints->IsPermittedDNSName("*.bar.com"));
  // All expansions of wildcard are within excluded.
  EXPECT_FALSE(name_constraints->IsPermittedDNSName("*.foo.bar.com"));
}